

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::compute_hash_raytracing_pipeline
               (StateRecorder *recorder,VkRayTracingPipelineCreateInfoKHR *create_info,
               Hash *out_hash)

{
  uint uVar1;
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar2;
  VkPipelineDynamicStateCreateInfo *pVVar3;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar4;
  bool bVar5;
  bool bVar6;
  VkBaseInStructure *base_in;
  int *piVar7;
  long lVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  Hash hash;
  Hasher local_48;
  ulong local_40;
  ulong *local_38;
  
  piVar7 = (int *)create_info->pNext;
  if (piVar7 != (int *)0x0) {
    uVar11 = 0x8328807b4eb6fed;
    do {
      if (*piVar7 == 0x3ba1f5f5) goto LAB_00127642;
      piVar7 = *(int **)(piVar7 + 2);
    } while (piVar7 != (int *)0x0);
  }
  uVar11 = ((ulong)(create_info->flags & 0x7ffffc3f) ^ 0xaf63bd4c8601b7df) * 0x100000001b3;
LAB_00127642:
  uVar1 = create_info->maxPipelineRayRecursionDepth;
  bVar5 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&local_40);
  if (bVar5) {
    uVar11 = (local_40 & 0xffffffff ^ (uVar11 ^ uVar1) * 0x100000001b3) * 0x100000001b3 ^
             local_40 >> 0x20;
    local_38 = out_hash;
    if (((create_info->flags & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
      uVar11 = uVar11 * 0x100000001b3;
    }
    else {
      bVar5 = StateRecorder::get_hash_for_raytracing_pipeline_handle
                        (recorder,create_info->basePipelineHandle,&local_40);
      if (!bVar5) goto LAB_0012789e;
      uVar11 = ((local_40 & 0xffffffff ^ uVar11 * 0x100000001b3) * 0x100000001b3 ^ local_40 >> 0x20)
               * 0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
    }
    local_48.h = uVar11 * 0x100000001b3 ^ (ulong)create_info->stageCount;
    if ((ulong)create_info->stageCount != 0) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        bVar5 = compute_hash_stage(recorder,&local_48,
                                   (VkPipelineShaderStageCreateInfo *)
                                   ((long)&create_info->pStages->sType + lVar8));
        if (!bVar5) goto LAB_0012789e;
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar11 < create_info->stageCount);
    }
    pVVar2 = create_info->pLibraryInterface;
    if (pVVar2 == (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
    }
    else {
      local_48.h = (local_48.h * 0x100000001b3 ^ (ulong)pVVar2->maxPipelineRayHitAttributeSize) *
                   0x100000001b3 ^ (ulong)pVVar2->maxPipelineRayPayloadSize;
      bVar5 = hash_pnext_chain(recorder,&local_48,pVVar2->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar5) {
        return false;
      }
    }
    pVVar3 = create_info->pDynamicState;
    if (pVVar3 == (VkPipelineDynamicStateCreateInfo *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
    }
    else {
      uVar11 = (ulong)pVVar3->dynamicStateCount;
      local_48.h = (local_48.h * 0x100000001b3 ^ uVar11) * 0x100000001b3 ^ (ulong)pVVar3->flags;
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar3->pDynamicStates[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      bVar5 = hash_pnext_chain(recorder,&local_48,pVVar3->pNext,(DynamicStateInfo *)0x0,0);
      if (!bVar5) {
        return false;
      }
    }
    local_48.h = local_48.h * 0x100000001b3 ^ (ulong)create_info->groupCount;
    if ((ulong)create_info->groupCount != 0) {
      lVar8 = 0x20;
      uVar11 = 0;
      do {
        pVVar4 = create_info->pGroups;
        local_48.h = ((((local_48.h * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar4 + lVar8 + -0x10)
                        ) * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar4 + lVar8 + -4)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)pVVar4 + lVar8 + -8)) * 0x100000001b3
                     ^ (ulong)*(uint *)((long)pVVar4 + lVar8 + -0xc)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar4->sType + lVar8);
        bVar5 = hash_pnext_chain(recorder,&local_48,*(void **)((long)pVVar4 + lVar8 + -0x18),
                                 (DynamicStateInfo *)0x0,0);
        if (!bVar5) {
          return false;
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar11 < create_info->groupCount);
    }
    if (create_info->pLibraryInfo == (VkPipelineLibraryCreateInfoKHR *)0x0) {
      local_48.h = local_48.h * 0x100000001b3;
      puVar9 = local_38;
    }
    else {
      bVar5 = hash_pnext_struct(recorder,&local_48,create_info->pLibraryInfo);
      puVar9 = local_38;
      if (!bVar5) goto LAB_0012789e;
      bVar5 = hash_pnext_chain(recorder,&local_48,create_info->pLibraryInfo->pNext,
                               (DynamicStateInfo *)0x0,0);
      if (!bVar5) {
        return false;
      }
    }
    bVar5 = false;
    bVar6 = hash_pnext_chain(recorder,&local_48,create_info->pNext,(DynamicStateInfo *)0x0,0);
    if (bVar6) {
      *puVar9 = local_48.h;
      bVar5 = true;
    }
  }
  else {
LAB_0012789e:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool compute_hash_raytracing_pipeline(const StateRecorder &recorder,
                                      const VkRayTracingPipelineCreateInfoKHR &create_info,
                                      Hash *out_hash)
{
	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	h.u32(create_info.maxPipelineRayRecursionDepth);

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_raytracing_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	h.u32(create_info.stageCount);
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		auto &stage = create_info.pStages[i];
		if (!compute_hash_stage(recorder, h, stage))
			return false;
	}

	if (create_info.pLibraryInterface)
	{
		h.u32(create_info.pLibraryInterface->maxPipelineRayHitAttributeSize);
		h.u32(create_info.pLibraryInterface->maxPipelineRayPayloadSize);
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInterface->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (create_info.pDynamicState)
	{
		h.u32(create_info.pDynamicState->dynamicStateCount);
		h.u32(create_info.pDynamicState->flags);
		for (uint32_t i = 0; i < create_info.pDynamicState->dynamicStateCount; i++)
			h.u32(create_info.pDynamicState->pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, create_info.pDynamicState->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	h.u32(create_info.groupCount);
	for (uint32_t i = 0; i < create_info.groupCount; i++)
	{
		auto &group = create_info.pGroups[i];
		h.u32(group.type);
		h.u32(group.anyHitShader);
		h.u32(group.closestHitShader);
		h.u32(group.generalShader);
		h.u32(group.intersectionShader);
		if (!hash_pnext_chain(&recorder, h, group.pNext, nullptr, 0))
			return false;
	}

	if (create_info.pLibraryInfo)
	{
		if (!hash_pnext_struct(&recorder, h, *create_info.pLibraryInfo))
			return false;
		if (!hash_pnext_chain(&recorder, h, create_info.pLibraryInfo->pNext, nullptr, 0))
			return false;
	}
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}